

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O1

Status __thiscall
leveldb::DBConstructor::FinishImpl(DBConstructor *this,Options *options,KVMap *data)

{
  _Rb_tree_node_base *p_Var1;
  long in_RCX;
  WriteBatch batch;
  undefined1 local_209;
  Slice local_208;
  DBConstructor *local_1f8;
  WriteBatch local_1f0;
  Tester local_1d0;
  
  local_1f8 = this;
  if (*(long **)&options->block_restart_interval != (long *)0x0) {
    (**(code **)(**(long **)&options->block_restart_interval + 8))();
  }
  *(undefined8 *)&options->block_restart_interval = 0;
  NewDB((DBConstructor *)options);
  p_Var1 = *(_Rb_tree_node_base **)(in_RCX + 0x18);
  if (p_Var1 != (_Rb_tree_node_base *)(in_RCX + 8)) {
    do {
      WriteBatch::WriteBatch(&local_1f0);
      local_1d0._0_8_ = *(undefined8 *)(p_Var1 + 1);
      local_1d0.fname_ = (char *)p_Var1[1]._M_parent;
      local_208.data_ = *(char **)(p_Var1 + 2);
      local_208.size_ = (size_t)p_Var1[2]._M_parent;
      WriteBatch::Put(&local_1f0,(Slice *)&local_1d0,&local_208);
      local_1d0.ok_ = true;
      local_1d0.fname_ =
           "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/table_test.cc"
      ;
      local_1d0.line_ = 0x157;
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1d0.ss_);
      local_209 = 0;
      (**(code **)(**(long **)&options->block_restart_interval + 0x20))
                (&local_208,*(long **)&options->block_restart_interval,&local_209,&local_1f0);
      test::Tester::Is(&local_1d0,local_208.data_ == (char *)0x0,
                       "db_->Write(WriteOptions(), &batch).ok()");
      if (local_208.data_ != (char *)0x0) {
        operator_delete__(local_208.data_);
      }
      test::Tester::~Tester(&local_1d0);
      WriteBatch::~WriteBatch(&local_1f0);
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1);
    } while (p_Var1 != (_Rb_tree_node_base *)(in_RCX + 8));
  }
  (local_1f8->super_Constructor)._vptr_Constructor = (_func_int **)0x0;
  return (Status)(char *)local_1f8;
}

Assistant:

Status FinishImpl(const Options& options, const KVMap& data) override {
    delete db_;
    db_ = nullptr;
    NewDB();
    for (const auto& kvp : data) {
      WriteBatch batch;
      batch.Put(kvp.first, kvp.second);
      ASSERT_TRUE(db_->Write(WriteOptions(), &batch).ok());
    }
    return Status::OK();
  }